

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_config(int op,...)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  _func_void_void_ptr *p_Var3;
  _func_int_void_ptr *p_Var4;
  u8 uVar5;
  sqlite3_pcache_methods2 *psVar6;
  void *pvVar7;
  undefined8 uVar8;
  char in_AL;
  long *plVar9;
  undefined8 in_RCX;
  ulong uVar10;
  long lVar11;
  undefined8 in_RDX;
  int iVar12;
  int iVar13;
  undefined8 in_RSI;
  sqlite3_pcache_methods2 *psVar14;
  sqlite3_pcache_methods2 *psVar15;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  byte bVar16;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 auStack_d8 [8];
  sqlite3_pcache_methods2 *local_d0;
  void *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined4 local_98;
  undefined4 local_88;
  undefined4 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined1 *local_28;
  long *plStack_20;
  undefined1 *local_18;
  long local_10;
  
  bVar16 = 0;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Da;
    local_98 = in_XMM1_Da;
    local_88 = in_XMM2_Da;
    local_78 = in_XMM3_Da;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  plStack_20 = (long *)&DAT_aaaaaaaaaaaaaaaa;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if ((sqlite3Config.isInit != 0) &&
     ((0x3f < (uint)op || ((0x1010000UL >> ((ulong)(uint)op & 0x3f) & 1) == 0)))) {
    local_d0 = (sqlite3_pcache_methods2 *)in_RSI;
    local_c8 = (void *)in_RDX;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x2c6d5,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    iVar13 = 0x15;
    psVar6 = local_d0;
    pvVar7 = local_c8;
    uVar8 = local_c0;
    goto switchD_0012bbb4_caseD_e;
  }
  plStack_20 = (long *)&stack0x00000008;
  local_28 = (undefined1 *)0x3000000008;
  iVar12 = 0;
  uVar5 = (u8)local_d0;
  iVar13 = 0;
  psVar6 = (sqlite3_pcache_methods2 *)in_RSI;
  pvVar7 = (void *)in_RDX;
  uVar8 = in_RCX;
  local_18 = auStack_d8;
  psVar14 = local_d0;
  switch(op) {
  case 1:
    sqlite3Config.bCoreMutex = '\0';
    sqlite3Config.bFullMutex = '\0';
    iVar13 = iVar12;
    psVar6 = (sqlite3_pcache_methods2 *)in_RSI;
    pvVar7 = (void *)in_RDX;
    uVar8 = in_RCX;
    local_18 = auStack_d8;
    break;
  case 2:
    sqlite3Config.bCoreMutex = '\x01';
    sqlite3Config.bFullMutex = '\0';
    iVar13 = iVar12;
    psVar6 = (sqlite3_pcache_methods2 *)in_RSI;
    pvVar7 = (void *)in_RDX;
    uVar8 = in_RCX;
    local_18 = auStack_d8;
    break;
  case 3:
    sqlite3Config.bCoreMutex = '\x01';
    sqlite3Config.bFullMutex = '\x01';
    iVar13 = iVar12;
    psVar6 = (sqlite3_pcache_methods2 *)in_RSI;
    pvVar7 = (void *)in_RDX;
    uVar8 = in_RCX;
    local_18 = auStack_d8;
    break;
  case 4:
    local_28 = (undefined1 *)0x3000000010;
    sqlite3Config.m.xMalloc = *(_func_void_ptr_int **)local_d0;
    sqlite3Config.m.xFree = (_func_void_void_ptr *)local_d0->pArg;
    sqlite3Config.m.xRealloc = (_func_void_ptr_void_ptr_int *)local_d0->xInit;
    sqlite3Config.m.xSize = (_func_int_void_ptr *)local_d0->xShutdown;
    sqlite3Config.m.xRoundup = (_func_int_int *)local_d0->xCreate;
    sqlite3Config.m.xInit = (_func_int_void_ptr *)local_d0->xCachesize;
    sqlite3Config.m.xShutdown = (_func_void_void_ptr *)local_d0->xPagecount;
    sqlite3Config.m.pAppData = local_d0->xFetch;
    iVar13 = iVar12;
    psVar6 = (sqlite3_pcache_methods2 *)in_RSI;
    pvVar7 = (void *)in_RDX;
    uVar8 = in_RCX;
    local_18 = auStack_d8;
    break;
  case 5:
    local_d0 = (sqlite3_pcache_methods2 *)in_RSI;
    local_c8 = (void *)in_RDX;
    local_18 = auStack_d8;
    if (sqlite3Config.m.xMalloc == (_func_void_ptr_int *)0x0) {
      local_18 = auStack_d8;
      sqlite3_config(4,sqlite3MemSetDefault_defaultMethods);
    }
    pvVar7 = sqlite3Config.m.pAppData;
    uVar10 = (ulong)local_28 & 0xffffffff;
    if (uVar10 < 0x29) {
      local_28 = (undefined1 *)CONCAT44(local_28._4_4_,(int)local_28 + 8);
      plVar9 = (long *)(local_18 + uVar10);
    }
    else {
      plVar9 = plStack_20;
      plStack_20 = plStack_20 + 1;
    }
    puVar1 = (undefined8 *)*plVar9;
    puVar1[6] = sqlite3Config.m.xShutdown;
    puVar1[7] = pvVar7;
    p_Var4 = sqlite3Config.m.xInit;
    puVar1[4] = sqlite3Config.m.xRoundup;
    puVar1[5] = p_Var4;
    p_Var4 = sqlite3Config.m.xSize;
    puVar1[2] = sqlite3Config.m.xRealloc;
    puVar1[3] = p_Var4;
    p_Var3 = sqlite3Config.m.xFree;
    *puVar1 = sqlite3Config.m.xMalloc;
    puVar1[1] = p_Var3;
    iVar13 = iVar12;
    psVar6 = local_d0;
    pvVar7 = local_c8;
    uVar8 = local_c0;
    break;
  default:
    iVar13 = 1;
    psVar6 = (sqlite3_pcache_methods2 *)in_RSI;
    pvVar7 = (void *)in_RDX;
    uVar8 = in_RCX;
    local_18 = auStack_d8;
    break;
  case 7:
    sqlite3Config.pPage = local_d0;
    sqlite3Config.szPage = (int)local_c8;
    local_28 = (undefined1 *)0x3000000020;
    sqlite3Config.nPage = (int)local_c0;
    iVar13 = iVar12;
    psVar6 = (sqlite3_pcache_methods2 *)in_RSI;
    pvVar7 = (void *)in_RDX;
    uVar8 = in_RCX;
    local_18 = auStack_d8;
    break;
  case 9:
    local_28 = (undefined1 *)0x3000000010;
    sqlite3Config.bMemstat = (u32)local_d0;
    iVar13 = iVar12;
    psVar6 = (sqlite3_pcache_methods2 *)in_RSI;
    pvVar7 = (void *)in_RDX;
    uVar8 = in_RCX;
    local_18 = auStack_d8;
    break;
  case 10:
    psVar15 = (sqlite3_pcache_methods2 *)&sqlite3Config.mutex;
    goto LAB_0012c2e7;
  case 0xb:
    psVar14 = (sqlite3_pcache_methods2 *)&sqlite3Config.mutex;
    psVar15 = local_d0;
LAB_0012c2e7:
    local_28 = (undefined1 *)0x3000000010;
    lVar11 = 9;
    local_d0 = (sqlite3_pcache_methods2 *)in_RSI;
    local_c8 = (void *)in_RDX;
    local_18 = auStack_d8;
LAB_0012c2ec:
    for (; iVar13 = iVar12, psVar6 = local_d0, pvVar7 = local_c8, uVar8 = local_c0, lVar11 != 0;
        lVar11 = lVar11 + -1) {
      uVar2 = *(undefined4 *)&psVar14->field_0x4;
      psVar15->iVersion = psVar14->iVersion;
      *(undefined4 *)&psVar15->field_0x4 = uVar2;
      psVar14 = (sqlite3_pcache_methods2 *)((long)psVar14 + (ulong)bVar16 * -0x10 + 8);
      psVar15 = (sqlite3_pcache_methods2 *)((long)psVar15 + (ulong)bVar16 * -0x10 + 8);
    }
    break;
  case 0xd:
    sqlite3Config.szLookaside = (u32)local_d0;
    local_28 = (undefined1 *)0x3000000018;
    sqlite3Config.nLookaside = (int)local_c8;
    iVar13 = iVar12;
    psVar6 = (sqlite3_pcache_methods2 *)in_RSI;
    pvVar7 = (void *)in_RDX;
    uVar8 = in_RCX;
    local_18 = auStack_d8;
    break;
  case 0xe:
    break;
  case 0x10:
    sqlite3Config.xLog = (_func_void_void_ptr_int_char_ptr *)local_d0;
    local_28 = (undefined1 *)0x3000000018;
    sqlite3Config.pLogArg = local_c8;
    iVar13 = iVar12;
    psVar6 = (sqlite3_pcache_methods2 *)in_RSI;
    pvVar7 = (void *)in_RDX;
    uVar8 = in_RCX;
    local_18 = auStack_d8;
    break;
  case 0x11:
    local_28 = (undefined1 *)0x3000000010;
    sqlite3Config.bOpenUri = uVar5;
    iVar13 = iVar12;
    psVar6 = (sqlite3_pcache_methods2 *)in_RSI;
    pvVar7 = (void *)in_RDX;
    uVar8 = in_RCX;
    local_18 = auStack_d8;
    break;
  case 0x12:
    local_28 = (undefined1 *)0x3000000010;
    psVar15 = &sqlite3Config.pcache2;
    local_d0 = (sqlite3_pcache_methods2 *)in_RSI;
    local_c8 = (void *)in_RDX;
    local_18 = auStack_d8;
    goto LAB_0012c2c2;
  case 0x13:
    local_d0 = (sqlite3_pcache_methods2 *)in_RSI;
    local_c8 = (void *)in_RDX;
    local_18 = auStack_d8;
    if (sqlite3Config.pcache2.xInit == (_func_int_void_ptr *)0x0) {
      local_18 = auStack_d8;
      sqlite3_config(0x12,sqlite3PCacheSetDefault_defaultMethods);
    }
    uVar10 = (ulong)local_28 & 0xffffffff;
    if (uVar10 < 0x29) {
      local_28 = (undefined1 *)CONCAT44(local_28._4_4_,(int)local_28 + 8);
      plVar9 = (long *)(local_18 + uVar10);
    }
    else {
      plVar9 = plStack_20;
      plStack_20 = plStack_20 + 1;
    }
    psVar15 = (sqlite3_pcache_methods2 *)*plVar9;
    psVar14 = &sqlite3Config.pcache2;
LAB_0012c2c2:
    lVar11 = 0xd;
    goto LAB_0012c2ec;
  case 0x14:
    local_28 = (undefined1 *)0x3000000010;
    sqlite3Config.bUseCis = uVar5;
    iVar13 = iVar12;
    psVar6 = (sqlite3_pcache_methods2 *)in_RSI;
    pvVar7 = (void *)in_RDX;
    uVar8 = in_RCX;
    local_18 = auStack_d8;
    break;
  case 0x16:
    local_28 = (undefined1 *)0x3000000018;
    sqlite3Config.mxMmap = (sqlite3_int64)(void *)0x7fff0000;
    if (local_c8 < (void *)0x7fff0000) {
      sqlite3Config.mxMmap = (sqlite3_int64)local_c8;
    }
    sqlite3Config.szMmap = (sqlite3_int64)(sqlite3_pcache_methods2 *)0x0;
    if (0 < (long)local_d0) {
      sqlite3Config.szMmap = (sqlite3_int64)local_d0;
    }
    iVar13 = 0;
    psVar6 = (sqlite3_pcache_methods2 *)in_RSI;
    pvVar7 = (void *)in_RDX;
    uVar8 = in_RCX;
    local_18 = auStack_d8;
    if (sqlite3Config.mxMmap < (long)local_d0) {
      sqlite3Config.szMmap = sqlite3Config.mxMmap;
      psVar6 = (sqlite3_pcache_methods2 *)in_RSI;
      pvVar7 = (void *)in_RDX;
      uVar8 = in_RCX;
      local_18 = auStack_d8;
    }
    break;
  case 0x18:
    local_28 = (undefined1 *)0x3000000010;
    local_d0->iVersion = 0x110;
    iVar13 = iVar12;
    psVar6 = (sqlite3_pcache_methods2 *)in_RSI;
    pvVar7 = (void *)in_RDX;
    uVar8 = in_RCX;
    local_18 = auStack_d8;
    break;
  case 0x19:
    local_28 = (undefined1 *)0x3000000010;
    sqlite3Config.szPma = (u32)local_d0;
    iVar13 = iVar12;
    psVar6 = (sqlite3_pcache_methods2 *)in_RSI;
    pvVar7 = (void *)in_RDX;
    uVar8 = in_RCX;
    local_18 = auStack_d8;
    break;
  case 0x1a:
    local_28 = (undefined1 *)0x3000000010;
    sqlite3Config.nStmtSpill = (u32)local_d0;
    iVar13 = iVar12;
    psVar6 = (sqlite3_pcache_methods2 *)in_RSI;
    pvVar7 = (void *)in_RDX;
    uVar8 = in_RCX;
    local_18 = auStack_d8;
    break;
  case 0x1b:
    local_28 = (undefined1 *)0x3000000010;
    sqlite3Config.bSmallMalloc = uVar5;
    iVar13 = iVar12;
    psVar6 = (sqlite3_pcache_methods2 *)in_RSI;
    pvVar7 = (void *)in_RDX;
    uVar8 = in_RCX;
    local_18 = auStack_d8;
    break;
  case 0x1d:
    local_28 = (undefined1 *)0x3000000010;
    sqlite3Config.mxMemdbSize = (sqlite3_int64)local_d0;
    iVar13 = iVar12;
    psVar6 = (sqlite3_pcache_methods2 *)in_RSI;
    pvVar7 = (void *)in_RDX;
    uVar8 = in_RCX;
    local_18 = auStack_d8;
    break;
  case 0x1e:
    local_28 = (undefined1 *)0x3000000010;
    local_d0->iVersion = 0;
    iVar13 = iVar12;
    psVar6 = (sqlite3_pcache_methods2 *)in_RSI;
    pvVar7 = (void *)in_RDX;
    uVar8 = in_RCX;
    local_18 = auStack_d8;
  }
switchD_0012bbb4_caseD_e:
  local_c0 = uVar8;
  local_c8 = pvVar7;
  local_d0 = psVar6;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return iVar13;
}

Assistant:

SQLITE_API int sqlite3_config(int op, ...){
  va_list ap;
  int rc = SQLITE_OK;

  /* sqlite3_config() normally returns SQLITE_MISUSE if it is invoked while
  ** the SQLite library is in use.  Except, a few selected opcodes
  ** are allowed.
  */
  if( sqlite3GlobalConfig.isInit ){
    static const u64 mAnytimeConfigOption = 0
       | MASKBIT64( SQLITE_CONFIG_LOG )
       | MASKBIT64( SQLITE_CONFIG_PCACHE_HDRSZ )
    ;
    if( op<0 || op>63 || (MASKBIT64(op) & mAnytimeConfigOption)==0 ){
      return SQLITE_MISUSE_BKPT;
    }
    testcase( op==SQLITE_CONFIG_LOG );
    testcase( op==SQLITE_CONFIG_PCACHE_HDRSZ );
  }

  va_start(ap, op);
  switch( op ){

    /* Mutex configuration options are only available in a threadsafe
    ** compile.
    */
#if defined(SQLITE_THREADSAFE) && SQLITE_THREADSAFE>0  /* IMP: R-54466-46756 */
    case SQLITE_CONFIG_SINGLETHREAD: {
      /* EVIDENCE-OF: R-02748-19096 This option sets the threading mode to
      ** Single-thread. */
      sqlite3GlobalConfig.bCoreMutex = 0;  /* Disable mutex on core */
      sqlite3GlobalConfig.bFullMutex = 0;  /* Disable mutex on connections */
      break;
    }
#endif
#if defined(SQLITE_THREADSAFE) && SQLITE_THREADSAFE>0 /* IMP: R-20520-54086 */
    case SQLITE_CONFIG_MULTITHREAD: {
      /* EVIDENCE-OF: R-14374-42468 This option sets the threading mode to
      ** Multi-thread. */
      sqlite3GlobalConfig.bCoreMutex = 1;  /* Enable mutex on core */
      sqlite3GlobalConfig.bFullMutex = 0;  /* Disable mutex on connections */
      break;
    }
#endif
#if defined(SQLITE_THREADSAFE) && SQLITE_THREADSAFE>0 /* IMP: R-59593-21810 */
    case SQLITE_CONFIG_SERIALIZED: {
      /* EVIDENCE-OF: R-41220-51800 This option sets the threading mode to
      ** Serialized. */
      sqlite3GlobalConfig.bCoreMutex = 1;  /* Enable mutex on core */
      sqlite3GlobalConfig.bFullMutex = 1;  /* Enable mutex on connections */
      break;
    }
#endif
#if defined(SQLITE_THREADSAFE) && SQLITE_THREADSAFE>0 /* IMP: R-63666-48755 */
    case SQLITE_CONFIG_MUTEX: {
      /* Specify an alternative mutex implementation */
      sqlite3GlobalConfig.mutex = *va_arg(ap, sqlite3_mutex_methods*);
      break;
    }
#endif
#if defined(SQLITE_THREADSAFE) && SQLITE_THREADSAFE>0 /* IMP: R-14450-37597 */
    case SQLITE_CONFIG_GETMUTEX: {
      /* Retrieve the current mutex implementation */
      *va_arg(ap, sqlite3_mutex_methods*) = sqlite3GlobalConfig.mutex;
      break;
    }
#endif

    case SQLITE_CONFIG_MALLOC: {
      /* EVIDENCE-OF: R-55594-21030 The SQLITE_CONFIG_MALLOC option takes a
      ** single argument which is a pointer to an instance of the
      ** sqlite3_mem_methods structure. The argument specifies alternative
      ** low-level memory allocation routines to be used in place of the memory
      ** allocation routines built into SQLite. */
      sqlite3GlobalConfig.m = *va_arg(ap, sqlite3_mem_methods*);
      break;
    }
    case SQLITE_CONFIG_GETMALLOC: {
      /* EVIDENCE-OF: R-51213-46414 The SQLITE_CONFIG_GETMALLOC option takes a
      ** single argument which is a pointer to an instance of the
      ** sqlite3_mem_methods structure. The sqlite3_mem_methods structure is
      ** filled with the currently defined memory allocation routines. */
      if( sqlite3GlobalConfig.m.xMalloc==0 ) sqlite3MemSetDefault();
      *va_arg(ap, sqlite3_mem_methods*) = sqlite3GlobalConfig.m;
      break;
    }
    case SQLITE_CONFIG_MEMSTATUS: {
      assert( !sqlite3GlobalConfig.isInit );  /* Cannot change at runtime */
      /* EVIDENCE-OF: R-61275-35157 The SQLITE_CONFIG_MEMSTATUS option takes
      ** single argument of type int, interpreted as a boolean, which enables
      ** or disables the collection of memory allocation statistics. */
      sqlite3GlobalConfig.bMemstat = va_arg(ap, int);
      break;
    }
    case SQLITE_CONFIG_SMALL_MALLOC: {
      sqlite3GlobalConfig.bSmallMalloc = va_arg(ap, int);
      break;
    }
    case SQLITE_CONFIG_PAGECACHE: {
      /* EVIDENCE-OF: R-18761-36601 There are three arguments to
      ** SQLITE_CONFIG_PAGECACHE: A pointer to 8-byte aligned memory (pMem),
      ** the size of each page cache line (sz), and the number of cache lines
      ** (N). */
      sqlite3GlobalConfig.pPage = va_arg(ap, void*);
      sqlite3GlobalConfig.szPage = va_arg(ap, int);
      sqlite3GlobalConfig.nPage = va_arg(ap, int);
      break;
    }
    case SQLITE_CONFIG_PCACHE_HDRSZ: {
      /* EVIDENCE-OF: R-39100-27317 The SQLITE_CONFIG_PCACHE_HDRSZ option takes
      ** a single parameter which is a pointer to an integer and writes into
      ** that integer the number of extra bytes per page required for each page
      ** in SQLITE_CONFIG_PAGECACHE. */
      *va_arg(ap, int*) =
          sqlite3HeaderSizeBtree() +
          sqlite3HeaderSizePcache() +
          sqlite3HeaderSizePcache1();
      break;
    }

    case SQLITE_CONFIG_PCACHE: {
      /* no-op */
      break;
    }
    case SQLITE_CONFIG_GETPCACHE: {
      /* now an error */
      rc = SQLITE_ERROR;
      break;
    }

    case SQLITE_CONFIG_PCACHE2: {
      /* EVIDENCE-OF: R-63325-48378 The SQLITE_CONFIG_PCACHE2 option takes a
      ** single argument which is a pointer to an sqlite3_pcache_methods2
      ** object. This object specifies the interface to a custom page cache
      ** implementation. */
      sqlite3GlobalConfig.pcache2 = *va_arg(ap, sqlite3_pcache_methods2*);
      break;
    }
    case SQLITE_CONFIG_GETPCACHE2: {
      /* EVIDENCE-OF: R-22035-46182 The SQLITE_CONFIG_GETPCACHE2 option takes a
      ** single argument which is a pointer to an sqlite3_pcache_methods2
      ** object. SQLite copies of the current page cache implementation into
      ** that object. */
      if( sqlite3GlobalConfig.pcache2.xInit==0 ){
        sqlite3PCacheSetDefault();
      }
      *va_arg(ap, sqlite3_pcache_methods2*) = sqlite3GlobalConfig.pcache2;
      break;
    }

/* EVIDENCE-OF: R-06626-12911 The SQLITE_CONFIG_HEAP option is only
** available if SQLite is compiled with either SQLITE_ENABLE_MEMSYS3 or
** SQLITE_ENABLE_MEMSYS5 and returns SQLITE_ERROR if invoked otherwise. */
#if defined(SQLITE_ENABLE_MEMSYS3) || defined(SQLITE_ENABLE_MEMSYS5)
    case SQLITE_CONFIG_HEAP: {
      /* EVIDENCE-OF: R-19854-42126 There are three arguments to
      ** SQLITE_CONFIG_HEAP: An 8-byte aligned pointer to the memory, the
      ** number of bytes in the memory buffer, and the minimum allocation size.
      */
      sqlite3GlobalConfig.pHeap = va_arg(ap, void*);
      sqlite3GlobalConfig.nHeap = va_arg(ap, int);
      sqlite3GlobalConfig.mnReq = va_arg(ap, int);

      if( sqlite3GlobalConfig.mnReq<1 ){
        sqlite3GlobalConfig.mnReq = 1;
      }else if( sqlite3GlobalConfig.mnReq>(1<<12) ){
        /* cap min request size at 2^12 */
        sqlite3GlobalConfig.mnReq = (1<<12);
      }

      if( sqlite3GlobalConfig.pHeap==0 ){
        /* EVIDENCE-OF: R-49920-60189 If the first pointer (the memory pointer)
        ** is NULL, then SQLite reverts to using its default memory allocator
        ** (the system malloc() implementation), undoing any prior invocation of
        ** SQLITE_CONFIG_MALLOC.
        **
        ** Setting sqlite3GlobalConfig.m to all zeros will cause malloc to
        ** revert to its default implementation when sqlite3_initialize() is run
        */
        memset(&sqlite3GlobalConfig.m, 0, sizeof(sqlite3GlobalConfig.m));
      }else{
        /* EVIDENCE-OF: R-61006-08918 If the memory pointer is not NULL then the
        ** alternative memory allocator is engaged to handle all of SQLites
        ** memory allocation needs. */
#ifdef SQLITE_ENABLE_MEMSYS3
        sqlite3GlobalConfig.m = *sqlite3MemGetMemsys3();
#endif
#ifdef SQLITE_ENABLE_MEMSYS5
        sqlite3GlobalConfig.m = *sqlite3MemGetMemsys5();
#endif
      }
      break;
    }
#endif

    case SQLITE_CONFIG_LOOKASIDE: {
      sqlite3GlobalConfig.szLookaside = va_arg(ap, int);
      sqlite3GlobalConfig.nLookaside = va_arg(ap, int);
      break;
    }

    /* Record a pointer to the logger function and its first argument.
    ** The default is NULL.  Logging is disabled if the function pointer is
    ** NULL.
    */
    case SQLITE_CONFIG_LOG: {
      /* MSVC is picky about pulling func ptrs from va lists.
      ** http://support.microsoft.com/kb/47961
      ** sqlite3GlobalConfig.xLog = va_arg(ap, void(*)(void*,int,const char*));
      */
      typedef void(*LOGFUNC_t)(void*,int,const char*);
      LOGFUNC_t xLog = va_arg(ap, LOGFUNC_t);
      void *pLogArg = va_arg(ap, void*);
      AtomicStore(&sqlite3GlobalConfig.xLog, xLog);
      AtomicStore(&sqlite3GlobalConfig.pLogArg, pLogArg);
      break;
    }

    /* EVIDENCE-OF: R-55548-33817 The compile-time setting for URI filenames
    ** can be changed at start-time using the
    ** sqlite3_config(SQLITE_CONFIG_URI,1) or
    ** sqlite3_config(SQLITE_CONFIG_URI,0) configuration calls.
    */
    case SQLITE_CONFIG_URI: {
      /* EVIDENCE-OF: R-25451-61125 The SQLITE_CONFIG_URI option takes a single
      ** argument of type int. If non-zero, then URI handling is globally
      ** enabled. If the parameter is zero, then URI handling is globally
      ** disabled. */
      int bOpenUri = va_arg(ap, int);
      AtomicStore(&sqlite3GlobalConfig.bOpenUri, bOpenUri);
      break;
    }

    case SQLITE_CONFIG_COVERING_INDEX_SCAN: {
      /* EVIDENCE-OF: R-36592-02772 The SQLITE_CONFIG_COVERING_INDEX_SCAN
      ** option takes a single integer argument which is interpreted as a
      ** boolean in order to enable or disable the use of covering indices for
      ** full table scans in the query optimizer. */
      sqlite3GlobalConfig.bUseCis = va_arg(ap, int);
      break;
    }

#ifdef SQLITE_ENABLE_SQLLOG
    case SQLITE_CONFIG_SQLLOG: {
      typedef void(*SQLLOGFUNC_t)(void*, sqlite3*, const char*, int);
      sqlite3GlobalConfig.xSqllog = va_arg(ap, SQLLOGFUNC_t);
      sqlite3GlobalConfig.pSqllogArg = va_arg(ap, void *);
      break;
    }
#endif

    case SQLITE_CONFIG_MMAP_SIZE: {
      /* EVIDENCE-OF: R-58063-38258 SQLITE_CONFIG_MMAP_SIZE takes two 64-bit
      ** integer (sqlite3_int64) values that are the default mmap size limit
      ** (the default setting for PRAGMA mmap_size) and the maximum allowed
      ** mmap size limit. */
      sqlite3_int64 szMmap = va_arg(ap, sqlite3_int64);
      sqlite3_int64 mxMmap = va_arg(ap, sqlite3_int64);
      /* EVIDENCE-OF: R-53367-43190 If either argument to this option is
      ** negative, then that argument is changed to its compile-time default.
      **
      ** EVIDENCE-OF: R-34993-45031 The maximum allowed mmap size will be
      ** silently truncated if necessary so that it does not exceed the
      ** compile-time maximum mmap size set by the SQLITE_MAX_MMAP_SIZE
      ** compile-time option.
      */
      if( mxMmap<0 || mxMmap>SQLITE_MAX_MMAP_SIZE ){
        mxMmap = SQLITE_MAX_MMAP_SIZE;
      }
      if( szMmap<0 ) szMmap = SQLITE_DEFAULT_MMAP_SIZE;
      if( szMmap>mxMmap) szMmap = mxMmap;
      sqlite3GlobalConfig.mxMmap = mxMmap;
      sqlite3GlobalConfig.szMmap = szMmap;
      break;
    }

#if SQLITE_OS_WIN && defined(SQLITE_WIN32_MALLOC) /* IMP: R-04780-55815 */
    case SQLITE_CONFIG_WIN32_HEAPSIZE: {
      /* EVIDENCE-OF: R-34926-03360 SQLITE_CONFIG_WIN32_HEAPSIZE takes a 32-bit
      ** unsigned integer value that specifies the maximum size of the created
      ** heap. */
      sqlite3GlobalConfig.nHeap = va_arg(ap, int);
      break;
    }
#endif

    case SQLITE_CONFIG_PMASZ: {
      sqlite3GlobalConfig.szPma = va_arg(ap, unsigned int);
      break;
    }

    case SQLITE_CONFIG_STMTJRNL_SPILL: {
      sqlite3GlobalConfig.nStmtSpill = va_arg(ap, int);
      break;
    }

#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    case SQLITE_CONFIG_SORTERREF_SIZE: {
      int iVal = va_arg(ap, int);
      if( iVal<0 ){
        iVal = SQLITE_DEFAULT_SORTERREF_SIZE;
      }
      sqlite3GlobalConfig.szSorterRef = (u32)iVal;
      break;
    }
#endif /* SQLITE_ENABLE_SORTER_REFERENCES */

#ifndef SQLITE_OMIT_DESERIALIZE
    case SQLITE_CONFIG_MEMDB_MAXSIZE: {
      sqlite3GlobalConfig.mxMemdbSize = va_arg(ap, sqlite3_int64);
      break;
    }
#endif /* SQLITE_OMIT_DESERIALIZE */

    case SQLITE_CONFIG_ROWID_IN_VIEW: {
      int *pVal = va_arg(ap,int*);
#ifdef SQLITE_ALLOW_ROWID_IN_VIEW
      if( 0==*pVal ) sqlite3GlobalConfig.mNoVisibleRowid = TF_NoVisibleRowid;
      if( 1==*pVal ) sqlite3GlobalConfig.mNoVisibleRowid = 0;
      *pVal = (sqlite3GlobalConfig.mNoVisibleRowid==0);
#else
      *pVal = 0;
#endif
      break;
    }

    default: {
      rc = SQLITE_ERROR;
      break;
    }
  }
  va_end(ap);
  return rc;
}